

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O2

void __thiscall
SQOuterVar::SQOuterVar(SQOuterVar *this,SQObjectPtr *name,SQObjectPtr *src,SQOuterType t)

{
  (this->_name).super_SQObject._type = OT_NULL;
  (this->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_src).super_SQObject._type = OT_NULL;
  (this->_src).super_SQObject._unVal.pTable = (SQTable *)0x0;
  SQObjectPtr::operator=(&this->_name,name);
  SQObjectPtr::operator=(&this->_src,src);
  this->_type = t;
  return;
}

Assistant:

SQOuterVar(const SQObjectPtr &name,const SQObjectPtr &src,SQOuterType t)
    {
        _name = name;
        _src=src;
        _type=t;
    }